

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

bool __thiscall
soul::SimpleTokeniser::skipPastMatchingCloseDelimiter
          (SimpleTokeniser *this,TokenType openDelim,TokenType closeDelim)

{
  char *__s1;
  int iVar1;
  TokenType __s1_00;
  int depth;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  iVar2 = 0;
  do {
    __s1 = (this->super_SOULTokeniser).currentType.text;
    if (__s1 == "$eof") {
      bVar3 = true;
    }
    else if (__s1 == (char *)0x0) {
      bVar3 = false;
    }
    else {
      iVar1 = strcmp(__s1,"$eof");
      bVar3 = iVar1 == 0;
    }
    if (bVar3 != false) break;
    __s1_00 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::skip(&this->super_SOULTokeniser);
    if (__s1_00.text == openDelim.text) {
LAB_001e6db1:
      iVar2 = iVar2 + 1;
      bVar4 = true;
    }
    else {
      if (__s1_00.text != (char *)0x0 && openDelim.text != (char *)0x0) {
        iVar1 = strcmp(__s1_00.text,openDelim.text);
        if (iVar1 == 0) goto LAB_001e6db1;
      }
      if (__s1_00.text == closeDelim.text) {
LAB_001e6da9:
        iVar2 = iVar2 + -1;
        bVar4 = iVar2 != 0;
      }
      else {
        bVar4 = true;
        if (__s1_00.text != (char *)0x0 && closeDelim.text != (char *)0x0) {
          iVar1 = strcmp(__s1_00.text,closeDelim.text);
          if (iVar1 == 0) goto LAB_001e6da9;
        }
      }
    }
  } while (bVar4);
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool skipPastMatchingCloseDelimiter (TokenType openDelim, TokenType closeDelim)
    {
        int depth = 0;

        for (;;)
        {
            if (matches (Token::eof))
                return false;

            auto token = skip();

            if (token == openDelim)
            {
                ++depth;
            }
            else if (token == closeDelim)
            {
                if (--depth == 0)
                    return true;
            }
        }
    }